

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_type.cc
# Opt level: O3

void __thiscall Type::Prepare(Type *this,Env *env,int flags)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  Field *pFVar4;
  undefined4 extraout_var;
  Type *pTVar5;
  ID *pIVar6;
  LetField *this_00;
  Type *type;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  FieldList *pFVar7;
  Type *in_RCX;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  Field *pFVar8;
  void *in_R8;
  pointer ppFVar9;
  undefined1 local_80 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  string local_40;
  
  this->env_ = env;
  if (this->value_var_ == (ID *)0x0) {
    strfmt_abi_cxx11_((string *)local_80,"%s",(this->type_decl_id_->name)._M_dataplus._M_p);
  }
  else {
    in_RCX = (Type *)(this->value_var_->name)._M_dataplus._M_p;
    strfmt_abi_cxx11_((string *)local_80,"%s:%s",(this->type_decl_id_->name)._M_dataplus._M_p);
  }
  std::__cxx11::string::operator=((string *)&this->data_id_str_,(string *)local_80);
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  pFVar8 = (Field *)this->value_var_;
  if (pFVar8 != (Field *)0x0) {
    in_RCX = this;
    Env::AddID(this->env_,(ID *)pFVar8,this->value_var_type_,this);
    pcVar3 = Env::LValue(this->env_,this->value_var_);
    pFVar8 = (Field *)local_80;
    strfmt_abi_cxx11_((string *)pFVar8,"%s",pcVar3);
    std::__cxx11::string::operator=((string *)&this->lvalue_,(string *)pFVar8);
    if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
      pFVar8 = (Field *)(local_80._16_8_ + 1);
      operator_delete((void *)local_80._0_8_,(ulong)pFVar8);
    }
  }
  iVar1 = (int)in_RCX;
  pFVar7 = this->attr_letfields_;
  if (pFVar7 != (FieldList *)0x0) {
    for (ppFVar9 = (pFVar7->super__Vector_base<Field_*,_std::allocator<Field_*>_>)._M_impl.
                   super__Vector_impl_data._M_start; iVar1 = (int)in_RCX,
        ppFVar9 !=
        (pFVar7->super__Vector_base<Field_*,_std::allocator<Field_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppFVar9 = ppFVar9 + 1) {
      pFVar8 = *ppFVar9;
      AddField(this,pFVar8);
      pFVar7 = this->attr_letfields_;
    }
  }
  if (this->attr_exportsourcedata_ == true) {
    pFVar4 = (Field *)operator_new(0xa0);
    iVar1 = ID::clone(sourcedata_id,(__fn *)pFVar8,__child_stack,iVar1,in_R8);
    pTVar5 = Clone(&extern_type_const_bytestring->super_Type);
    Field::Field(pFVar4,PUB_VAR_FIELD,6,(ID *)CONCAT44(extraout_var,iVar1),pTVar5);
    (pFVar4->super_DataDepElement)._vptr_DataDepElement = (_func_int **)&PTR__Field_00145018;
    AddField(this,pFVar4);
  }
  if (this->attr_if_expr_ != (Expr *)0x0) {
    pIVar6 = (ID *)operator_new(0x78);
    strfmt_abi_cxx11_(&local_40,"has_%s",(this->value_var_->name)._M_dataplus._M_p);
    ID::ID(pIVar6,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._0_8_ + 1);
    }
    this_00 = (LetField *)operator_new(0xb0);
    pTVar5 = Clone(&extern_type_bool->super_Type);
    LetField::LetField(this_00,pIVar6,pTVar5,this->attr_if_expr_);
    this->has_value_field_ = this_00;
    AddField(this,(Field *)this_00);
  }
  if (this->incremental_input_ == true) {
    pTVar5 = (Type *)operator_new(0x78);
    if (this->value_var_ == (ID *)0x0) {
      pcVar3 = "val";
    }
    else {
      pcVar3 = (this->value_var_->name)._M_dataplus._M_p;
    }
    strfmt_abi_cxx11_((string *)&local_60,"%s_parsing_complete",pcVar3);
    ID::ID((ID *)pTVar5,(string *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_allocated_capacity != &local_50) {
      operator_delete((void *)local_60._M_allocated_capacity,local_50._M_allocated_capacity + 1);
    }
    if (FLAGS_pac_debug == true) {
      Prepare(pTVar5);
    }
    pFVar4 = (Field *)operator_new(0xa0);
    type = Clone(&extern_type_bool->super_Type);
    Field::Field(pFVar4,TEMP_VAR_FIELD,0,(ID *)pTVar5,type);
    iVar1 = (int)pTVar5;
    (pFVar4->super_DataDepElement)._vptr_DataDepElement = (_func_int **)&PTR__Field_00144208;
    this->parsing_complete_var_field_ = pFVar4;
    pFVar8 = (Field *)env;
    Field::Prepare(pFVar4,env);
    if (this->incremental_input_ == true) {
      iVar2 = (*(this->super_DataDepElement)._vptr_DataDepElement[0x16])(this);
      if ((iVar2 == 3) ||
         ((iVar2 == 2 &&
          ((this->attr_length_expr_ != (Expr *)0x0 || ((this->attr_restofflow_ & 1U) != 0)))))) {
        pFVar4 = (Field *)buffering_state_id;
        pTVar5 = Env::GetDataType(env,buffering_state_id);
        pFVar8 = pFVar4;
        if (pTVar5 == (Type *)0x0) {
          pFVar8 = (Field *)operator_new(0xa0);
          iVar1 = ID::clone(buffering_state_id,(__fn *)pFVar4,__child_stack_00,iVar1,type);
          pIVar6 = (ID *)CONCAT44(extraout_var_00,iVar1);
          type = Clone(&extern_type_int->super_Type);
          Field::Field(pFVar8,PRIV_VAR_FIELD,2,pIVar6,type);
          iVar1 = (int)pIVar6;
          (pFVar8->super_DataDepElement)._vptr_DataDepElement = (_func_int **)&PTR__Field_00144188;
          this->buffering_state_var_field_ = pFVar8;
          AddField(this,pFVar8);
        }
      }
    }
    if ((this->incremental_parsing_ == true) && (this->tot_ == RECORD)) {
      pFVar4 = (Field *)operator_new(0xa0);
      iVar1 = ID::clone(parsing_state_id,(__fn *)pFVar8,__child_stack_01,iVar1,type);
      pTVar5 = Clone(&extern_type_int->super_Type);
      Field::Field(pFVar4,PRIV_VAR_FIELD,2,(ID *)CONCAT44(extraout_var_01,iVar1),pTVar5);
      (pFVar4->super_DataDepElement)._vptr_DataDepElement = (_func_int **)&PTR__Field_00144188;
      this->parsing_state_var_field_ = pFVar4;
      AddField(this,pFVar4);
    }
  }
  pFVar7 = this->fields_;
  if (pFVar7 != (FieldList *)0x0) {
    for (ppFVar9 = (pFVar7->super__Vector_base<Field_*,_std::allocator<Field_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppFVar9 !=
        (pFVar7->super__Vector_base<Field_*,_std::allocator<Field_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppFVar9 = ppFVar9 + 1) {
      (*((*ppFVar9)->super_DataDepElement)._vptr_DataDepElement[4])(*ppFVar9,env);
      pFVar7 = this->fields_;
    }
  }
  return;
}

Assistant:

void Type::Prepare(Env* env, int flags)
	{
	env_ = env;
	ASSERT(env_);

	// The name of the value variable
	if ( value_var() )
		{
		data_id_str_ = strfmt("%s:%s", decl_id()->Name(), value_var()->Name());
		}
	else
		{
		data_id_str_ = strfmt("%s", decl_id()->Name());
		}

	if ( value_var() )
		{
		env_->AddID(value_var(), static_cast<IDType>(value_var_type_), this);
		lvalue_ = strfmt("%s", env_->LValue(value_var()));
		}

	foreach (i, FieldList, attr_letfields_)
		{
		AddField(*i);
		}

	if ( attr_exportsourcedata_ )
		{
		ASSERT(flags & TO_BE_PARSED);
		AddField(new PubVarField(sourcedata_id->clone(), extern_type_const_bytestring->Clone()));
		}

	// An optional field
	if ( attr_if_expr() )
		{
		ASSERT(value_var());
		ID* has_value_id = new ID(strfmt("has_%s", value_var()->Name()));
		has_value_field_ = new LetField(has_value_id, extern_type_bool->Clone(), attr_if_expr());
		AddField(has_value_field_);
		}

	if ( incremental_input() )
		{
		ASSERT(flags & TO_BE_PARSED);
		ID* parsing_complete_var = new ID(
			strfmt("%s_parsing_complete", value_var() ? value_var()->Name() : "val"));
		DEBUG_MSG("Adding parsing complete var: %s\n", parsing_complete_var->Name());
		parsing_complete_var_field_ = new TempVarField(parsing_complete_var,
		                                               extern_type_bool->Clone());
		parsing_complete_var_field_->Prepare(env);

		if ( NeedsBufferingStateVar() && ! env->GetDataType(buffering_state_id) )
			{
			buffering_state_var_field_ = new PrivVarField(buffering_state_id->clone(),
			                                              extern_type_int->Clone());
			AddField(buffering_state_var_field_);
			}

		if ( incremental_parsing() && tot_ == RECORD )
			{
			ASSERT(! parsing_state_var_field_);
			parsing_state_var_field_ = new PrivVarField(parsing_state_id->clone(),
			                                            extern_type_int->Clone());
			AddField(parsing_state_var_field_);
			}
		}

	foreach (i, FieldList, fields_)
		{
		Field* f = *i;
		f->Prepare(env);
		}
	}